

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O0

string * ApprovalTests::SystemUtils::getMachineName_abi_cxx11_(void)

{
  ulong uVar1;
  string *in_RDI;
  string name;
  string *name_00;
  allocator local_5d [13];
  string local_50 [36];
  undefined4 local_2c;
  string local_28 [40];
  
  name_00 = in_RDI;
  safeGetEnv_abi_cxx11_((char *)in_RDI);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)in_RDI,local_28);
  }
  else {
    safeGetEnv_abi_cxx11_((char *)name_00);
    ::std::__cxx11::string::operator=(local_28,local_50);
    ::std::__cxx11::string::~string(local_50);
    uVar1 = ::std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      ::std::__cxx11::string::string((string *)in_RDI,local_28);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)in_RDI,"Unknown Computer",local_5d);
      ::std::allocator<char>::~allocator((allocator<char> *)local_5d);
    }
  }
  local_2c = 1;
  ::std::__cxx11::string::~string(local_28);
  return name_00;
}

Assistant:

std::string SystemUtils::getMachineName()
    {
        auto name = safeGetEnv("COMPUTERNAME");
        if (!name.empty())
        {
            return name;
        }

        name = safeGetEnv("HOSTNAME");
        if (!name.empty())
        {
            return name;
        }

        return "Unknown Computer";
    }